

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<kj::HttpClient::Response>::wait
          (Promise<kj::HttpClient::Response> *this,void *__stat_loc)

{
  WaitScope *in_RDX;
  ExceptionOr<kj::HttpClient::Response> result;
  ExceptionOr<kj::HttpClient::Response> local_1a0;
  
  local_1a0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a0.value.ptr.isSet = false;
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1a0.super_ExceptionOrValue,in_RDX);
  if (local_1a0.value.ptr.isSet == true) {
    if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    this[1].super_PromiseBase.node.disposer =
         (Disposer *)local_1a0.value.ptr.field_1.value.statusText.content.size_;
    this[1].super_PromiseBase.node.ptr = (PromiseNode *)local_1a0.value.ptr.field_1.value.headers;
    (this->super_PromiseBase).node.disposer = (Disposer *)local_1a0.value.ptr.field_1._0_8_;
    (this->super_PromiseBase).node.ptr =
         (PromiseNode *)local_1a0.value.ptr.field_1.value.statusText.content.ptr;
    this[2].super_PromiseBase.node.disposer = local_1a0.value.ptr.field_1.value.body.disposer;
    this[2].super_PromiseBase.node.ptr = (PromiseNode *)local_1a0.value.ptr.field_1.value.body.ptr;
    local_1a0.value.ptr.field_1.value.body.ptr = (AsyncInputStream *)0x0;
    _::ExceptionOr<kj::HttpClient::Response>::~ExceptionOr(&local_1a0);
    return (__pid_t)this;
  }
  if (local_1a0.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&local_1a0.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }